

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O0

void glmc_translate_to(vec4 *m,float *v,vec4 *dest)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *in_RDX;
  undefined4 *in_RSI;
  undefined8 *in_RDI;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  __m128 afVar4;
  __m128 a;
  __m128 a_00;
  __m128 b;
  __m128 b_00;
  __m128 b_01;
  __m128 c;
  __m128 c_00;
  __m128 c_01;
  __m128 m3;
  __m128 m2;
  __m128 m1;
  __m128 m0;
  undefined8 uStack_b0;
  
  uVar2 = in_RDI[1];
  *in_RDX = *in_RDI;
  in_RDX[1] = uVar2;
  uVar2 = in_RDI[3];
  in_RDX[2] = in_RDI[2];
  in_RDX[3] = uVar2;
  uVar2 = in_RDI[5];
  in_RDX[4] = in_RDI[4];
  in_RDX[5] = uVar2;
  uVar2 = in_RDI[7];
  in_RDX[6] = in_RDI[6];
  in_RDX[7] = uVar2;
  uVar2 = *in_RDX;
  uVar3 = in_RDX[2];
  a_00[3] = (float)*in_RSI;
  a_00[2] = (float)*in_RSI;
  a[3] = (float)in_RSI[1];
  a[2] = (float)in_RSI[1];
  afVar4[3] = (float)in_RSI[2];
  afVar4[2] = (float)in_RSI[2];
  afVar4._0_8_ = in_RDX[4];
  b._8_8_ = in_XMM3_Qa;
  b._0_8_ = in_RDX[6];
  c._8_8_ = in_XMM5_Qa;
  c._0_8_ = in_XMM4_Qa;
  afVar4 = glmm_fmadd(afVar4,b,c);
  b_00._0_8_ = afVar4._0_8_;
  a._0_8_ = uVar3;
  b_00[2] = (float)(int)in_XMM3_Qa;
  b_00[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  c_00[2] = (float)(int)in_XMM5_Qa;
  c_00[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_00[0] = (float)(int)in_XMM4_Qa;
  c_00[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  afVar4 = glmm_fmadd(a,b_00,c_00);
  b_01._0_8_ = afVar4._0_8_;
  a_00._0_8_ = uVar2;
  b_01[2] = (float)(int)in_XMM3_Qa;
  b_01[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  c_01[2] = (float)(int)in_XMM5_Qa;
  c_01[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_01[0] = (float)(int)in_XMM4_Qa;
  c_01[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  afVar4 = glmm_fmadd(a_00,b_01,c_01);
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._0_8_ = afVar4._0_8_;
  auVar1._12_4_ = extraout_XMM0_Dd;
  uStack_b0 = auVar1._8_8_;
  in_RDX[6] = afVar4._0_8_;
  in_RDX[7] = uStack_b0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_translate_to(mat4 m, vec3 v, mat4 dest) {
  glm_translate_to(m, v, dest);
}